

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Radio_Communications_Header.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Radio_Communications_Header::Radio_Communications_Header
          (Radio_Communications_Header *this,Header *H)

{
  Header *H_local;
  Radio_Communications_Header *this_local;
  
  Header7::Header7(&this->super_Header,H);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Radio_Communications_Header_0033d6f8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EntityID);
  this->m_ui16RadioID = 0;
  return;
}

Assistant:

Radio_Communications_Header::Radio_Communications_Header( const Header & H ) :
    Header( H ),
    m_ui16RadioID( 0 )
{
}